

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-ni.c
# Opt level: O1

ssh_hash * sha256_ni_new(ssh_hashalg *alg)

{
  undefined8 *puVar1;
  undefined1 *puVar2;
  undefined1 uVar3;
  void *pvVar4;
  ssh_hash *psVar5;
  ulong uVar6;
  
  puVar1 = (undefined8 *)alg->extra;
  if (*(char *)puVar1[1] == '\0') {
    uVar3 = (*(code *)*puVar1)();
    puVar2 = (undefined1 *)puVar1[1];
    puVar2[1] = uVar3;
    *puVar2 = 1;
  }
  if (*(char *)(puVar1[1] + 1) == '\x01') {
    pvVar4 = safemalloc(0xaf,1,0);
    uVar6 = (long)pvVar4 + 0xfU & 0xfffffffffffffff0;
    *(void **)(uVar6 + 0x70) = pvVar4;
    psVar5 = (ssh_hash *)(uVar6 + 0x90);
    *(ssh_hashalg **)(uVar6 + 0x90) = alg;
    *(code **)(uVar6 + 0x78) = sha256_ni_write;
    *(undefined8 *)(uVar6 + 0x80) = 0;
    *(ulong *)(uVar6 + 0x88) = uVar6 + 0x78;
    *(ulong *)(uVar6 + 0x98) = uVar6 + 0x78;
  }
  else {
    psVar5 = (ssh_hash *)0x0;
  }
  return psVar5;
}

Assistant:

static ssh_hash *sha256_ni_new(const ssh_hashalg *alg)
{
    const struct sha256_extra *extra = (const struct sha256_extra *)alg->extra;
    if (!check_availability(extra))
        return NULL;

    sha256_ni *s = sha256_ni_alloc();

    s->hash.vt = alg;
    BinarySink_INIT(s, sha256_ni_write);
    BinarySink_DELEGATE_INIT(&s->hash, s);

    return &s->hash;
}